

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.h
# Opt level: O0

vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
* __thiscall
data_structures::RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_>::getAllNodes
          (vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
           *__return_storage_ptr__,
          RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this)

{
  anon_class_16_2_633b7cac local_48;
  undefined1 local_38 [8];
  function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
  fun;
  RBTree<int,_data_structures::WeightedGraphAdjSet<int,_int>_> *this_local;
  
  fun._M_invoker = (_Invoker_type)this;
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::clear(&this->_all_nodes);
  std::
  function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
  ::function((function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
              *)local_38);
  local_48.this = this;
  local_48.fun = (function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
                  *)local_38;
  std::
  function<void(data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*)>
  ::operator=((function<void(data_structures::RBTreeNode<data_structures::TreeElement<int,data_structures::WeightedGraphAdjSet<int,int>>>*)>
               *)local_38,&local_48);
  std::
  function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
  ::operator()((function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
                *)local_38,this->_root);
  std::
  vector<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_std::allocator<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*>_>
  ::vector(__return_storage_ptr__,&this->_all_nodes);
  std::
  function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
  ::~function((function<void_(data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*)>
               *)local_38);
  return __return_storage_ptr__;
}

Assistant:

inline
    std::vector<RBTreeNode<TreeElement<Key, Value>>*> RBTree<Key, Value>::getAllNodes(){
        _all_nodes.clear();
        std::function<void(RBTreeNode<TreeElement<Key, Value>>*)> fun;
        fun = [this, &fun](RBTreeNode<TreeElement<Key, Value>>* node) -> void {
            if (node == nullptr) {
                return;
            }
            _all_nodes.push_back(node);
            fun(node->left());
            fun(node->right());
        };
        fun(_root);
        return _all_nodes;
    }